

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-emscripten-finalize.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 *puVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer puVar2;
  undefined8 uVar3;
  ulong uVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  string *psVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  long lVar11;
  byte bVar12;
  undefined8 *puVar13;
  PassOptions *pPVar14;
  __node_base _Var15;
  _Hash_node_base *p_Var16;
  bool bVar17;
  byte bVar18;
  PassOptions local_14d8;
  undefined1 local_1420 [8];
  ToolOptions options;
  long local_1290 [45];
  uint local_1128;
  void *local_10d8;
  long local_10d0;
  undefined8 *local_10c8;
  undefined8 uStack_10c0;
  undefined1 local_eb0 [8];
  __alloc_node_gen_t __alloc_node_gen;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ea0 [48];
  long *local_ba0;
  PassRunner passRunner;
  long local_b90 [4];
  undefined1 local_b70;
  undefined1 local_b6e;
  undefined1 local_b4a;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  local_b28 [120];
  undefined1 local_ab0 [56];
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *local_a78;
  pointer local_a70;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_a68 [2];
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *local_a58;
  pointer local_a50;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> local_a48 [2];
  pointer local_a38;
  pointer local_a30;
  pointer local_a28;
  pointer local_a20;
  pointer local_a18;
  pointer local_a10;
  pointer local_a08;
  pointer local_a00;
  pointer local_9f8;
  size_t local_9f0;
  code *local_9e8;
  pointer local_9e0;
  pointer local_9d8;
  pointer local_9d0;
  __uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_> local_9c8;
  pointer local_9c0;
  pointer local_9b8;
  pointer local_9b0;
  pointer local_9a8;
  pointer local_9a0;
  pointer local_998;
  _Alloc_hider local_990;
  code *local_988;
  code *local_980;
  undefined8 local_978;
  _Alloc_hider local_970;
  code *local_968;
  code *local_960;
  undefined8 local_958;
  pointer local_950;
  pointer local_948;
  pointer local_940;
  undefined1 *local_938;
  size_t local_930;
  code *local_928;
  __buckets_ptr local_920;
  char *local_918;
  __node_base local_910;
  code *local_908;
  code *local_900;
  bool *local_8f8;
  __node_base_ptr local_8f0;
  __buckets_ptr local_8e8;
  code *local_8e0;
  __node_base local_8d8;
  size_type local_8d0;
  code *local_8c8;
  code *local_8c0;
  __node_base_ptr local_8b8;
  pointer local_8b0;
  pointer local_8a8;
  pointer local_8a0;
  undefined1 *local_898;
  id local_890;
  atomic<MixedArena_*> local_888;
  __buckets_ptr local_880;
  undefined1 *local_878;
  __node_base local_870;
  code *local_868;
  code *local_860;
  __buckets_ptr *local_858 [2];
  __buckets_ptr local_848 [2];
  char local_838;
  size_t *local_830 [2];
  size_t local_820 [2];
  char local_810;
  size_type *local_808 [2];
  size_type local_7f8 [2];
  char local_7e8;
  __node_base *local_7e0 [2];
  __node_base local_7d0 [2];
  char local_7c0;
  __node_base_ptr *local_7b8 [2];
  __node_base_ptr local_7a8 [2];
  char local_798;
  __node_base local_790 [2];
  _Hash_node_base local_780 [2];
  _Hash_node_base *local_770 [2];
  _Hash_node_base local_760 [2];
  size_t *local_750 [2];
  size_t local_740 [2];
  __node_base *local_730 [2];
  __node_base local_720 [2];
  __node_base_ptr *local_710 [2];
  __node_base_ptr local_700 [2];
  size_type *local_6f0 [2];
  size_type local_6e0 [2];
  long *local_6d0 [2];
  long local_6c0 [2];
  long *local_6b0 [2];
  long local_6a0 [2];
  long *local_690 [2];
  long local_680 [2];
  long *local_670 [2];
  long local_660 [2];
  long *local_650 [2];
  long local_640 [2];
  long *local_630 [2];
  long local_620 [2];
  char **local_610;
  long *local_608 [2];
  long local_5f8 [2];
  long *local_5e8 [2];
  long local_5d8 [2];
  long *local_5c8 [2];
  long local_5b8 [2];
  long *local_5a8 [2];
  long local_598 [2];
  long *local_588 [2];
  long local_578 [2];
  long *local_568 [2];
  long local_558 [2];
  long *local_548 [2];
  long local_538 [2];
  long *local_528 [2];
  long local_518 [2];
  long *local_508 [2];
  long local_4f8 [2];
  long *local_4e8 [2];
  long local_4d8 [2];
  long *local_4c8 [2];
  long local_4b8 [2];
  long *local_4a8 [2];
  long local_498 [2];
  long *local_488 [2];
  long local_478 [2];
  long *local_468 [2];
  long local_458 [2];
  long *local_448 [2];
  long local_438 [2];
  long *local_428 [2];
  long local_418 [2];
  long *local_408 [2];
  long local_3f8 [2];
  long *local_3e8 [2];
  long local_3d8 [2];
  long *local_3c8 [2];
  long local_3b8 [2];
  long *local_3a8 [2];
  long local_398 [2];
  long *local_388 [2];
  long local_378 [2];
  long *local_368 [2];
  long local_358 [2];
  long *local_348 [2];
  long local_338 [2];
  long *local_328 [2];
  long local_318 [2];
  long *local_308 [2];
  long local_2f8 [2];
  long *local_2e8 [2];
  long local_2d8 [2];
  long *local_2c8 [2];
  long local_2b8 [2];
  long *local_2a8 [2];
  long local_298 [2];
  long *local_288 [2];
  long local_278 [2];
  long *local_268 [2];
  long local_258 [2];
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  long *local_1a8 [2];
  long local_198 [2];
  long *local_188 [2];
  long local_178 [2];
  long *local_168 [2];
  long local_158 [2];
  long *local_148 [2];
  long local_138 [2];
  _Head_base<0UL,_wasm::Export_*,_false> local_128;
  string outfile;
  string inputSourceMapFilename;
  string outputSourceMapFilename;
  string outputSourceMapUrl;
  string infile;
  long local_78 [2];
  uint local_64;
  size_type *local_60;
  string WasmEmscriptenFinalizeOption;
  char local_38;
  char local_37;
  undefined1 local_36 [3];
  bool sideModule;
  bool minimizeWasmChanges;
  bool legalizeJavaScriptFFI;
  bool bigInt;
  bool checkStackOverflow;
  bool noDynCalls;
  bool onlyI64DynCalls;
  bool debugInfo;
  bool DWARF;
  bool standaloneWasm;
  bool emitBinary;
  
  bVar18 = 0;
  outputSourceMapUrl.field_2._8_8_ = &infile._M_string_length;
  infile._M_dataplus._M_p = (pointer)0x0;
  infile._M_string_length._0_1_ = 0;
  local_128._M_head_impl = (Export *)&outfile._M_string_length;
  outfile._M_dataplus._M_p = (pointer)0x0;
  outfile._M_string_length._0_1_ = 0;
  outfile.field_2._8_8_ = &inputSourceMapFilename._M_string_length;
  inputSourceMapFilename._M_dataplus._M_p = (pointer)0x0;
  inputSourceMapFilename._M_string_length._0_1_ = 0;
  inputSourceMapFilename.field_2._8_8_ = &outputSourceMapFilename._M_string_length;
  outputSourceMapFilename._M_dataplus._M_p = (pointer)0x0;
  outputSourceMapFilename._M_string_length._0_1_ = 0;
  outputSourceMapFilename.field_2._8_8_ = &outputSourceMapUrl._M_string_length;
  outputSourceMapUrl._M_dataplus._M_p = (pointer)0x0;
  outputSourceMapUrl._M_string_length._0_1_ = 0;
  legalizeJavaScriptFFI = true;
  local_36[2] = 0;
  sideModule = false;
  WasmEmscriptenFinalizeOption.field_2._M_local_buf[0xd] = '\0';
  WasmEmscriptenFinalizeOption.field_2._M_local_buf[0xf] = '\x01';
  local_38 = '\0';
  local_37 = '\0';
  minimizeWasmChanges = false;
  WasmEmscriptenFinalizeOption.field_2._M_local_buf[0xe] = '\0';
  local_36[0] = '\0';
  local_36[1] = '\0';
  local_60 = &WasmEmscriptenFinalizeOption._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"wasm-emscripten-finalize options","");
  options._376_8_ = local_1290;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&options.enabledFeatures,"wasm-emscripten-finalize","");
  local_eb0 = (undefined1  [8])local_ea0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_eb0,"Performs Emscripten-specific transforms on .wasm files","");
  wasm::ToolOptions::ToolOptions
            ((ToolOptions *)local_1420,(string *)&options.enabledFeatures,(string *)local_eb0);
  if (local_eb0 != (undefined1  [8])local_ea0) {
    operator_delete((void *)local_eb0,local_ea0[0]._M_allocated_capacity + 1);
  }
  if ((long *)options._376_8_ != local_1290) {
    operator_delete((void *)options._376_8_,local_1290[0] + 1);
  }
  options._376_8_ = local_1290;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"--output","");
  local_eb0 = (undefined1  [8])local_ea0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"-o","");
  local_ba0 = local_b90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ba0,"Output file","");
  local_ab0._8_8_ = (pointer)0x0;
  local_ab0._0_8_ = &local_128;
  local_ab0._24_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:69:10)>
       ::_M_invoke;
  local_ab0._16_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:69:10)>
       ::_M_manager;
  psVar8 = (string *)
           wasm::Options::add((string *)&options,(string *)&options.enabledFeatures,
                              (string *)local_eb0,(string *)&local_ba0,(Arguments)&local_60,
                              (function *)0x1,SUB81(local_ab0,0));
  infile.field_2._8_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&infile.field_2 + 8),"--debuginfo","");
  local_608[0] = local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"-g","");
  local_5e8[0] = local_5d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5e8,"Emit names section in wasm binary (or full debuginfo in wast)","")
  ;
  local_a30 = (pointer)0x0;
  local_a38 = (pointer)(local_36 + 2);
  local_a20 = (pointer)std::
                       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:78:10)>
                       ::_M_invoke;
  local_a28 = (pointer)std::
                       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:78:10)>
                       ::_M_manager;
  psVar8 = (string *)
           wasm::Options::add(psVar8,(string *)(infile.field_2._M_local_buf + 8),(string *)local_608
                              ,(string *)local_5e8,(Arguments)&local_60,(function *)0x0,
                              SUB81(&local_a38,0));
  local_5c8[0] = local_5b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"--dwarf","");
  local_5a8[0] = local_598;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"");
  local_588[0] = local_578;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"Update DWARF debug info","");
  local_a10 = (pointer)0x0;
  local_a18 = (pointer)&sideModule;
  local_a00 = (pointer)std::
                       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:84:10)>
                       ::_M_invoke;
  local_a08 = (pointer)std::
                       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:84:10)>
                       ::_M_manager;
  psVar8 = (string *)
           wasm::Options::add(psVar8,(string *)local_5c8,(string *)local_5a8,(string *)local_588,
                              (Arguments)&local_60,(function *)0x0,SUB81(&local_a18,0));
  local_568[0] = local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_568,"--emit-text","");
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"-S","");
  local_528[0] = local_518;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_528,
             "Emit text instead of binary for the output file. In this mode if no output file is specified, we write to stdout."
             ,"");
  local_9f0 = 0;
  local_9f8 = (pointer)&legalizeJavaScriptFFI;
  local_9e0 = (pointer)std::
                       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:91:10)>
                       ::_M_invoke;
  local_9e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:91:10)>
              ::_M_manager;
  psVar8 = (string *)
           wasm::Options::add(psVar8,(string *)local_568,(string *)local_548,(string *)local_528,
                              (Arguments)&local_60,(function *)0x0,SUB81(&local_9f8,0));
  local_508[0] = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"--side-module","");
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"");
  local_4c8[0] = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c8,"Input is an emscripten side module","");
  local_9d0 = (pointer)0x0;
  local_9d8 = (pointer)((long)&WasmEmscriptenFinalizeOption.field_2 + 0xd);
  local_9c0 = (pointer)std::
                       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:97:10)>
                       ::_M_invoke;
  local_9c8._M_t.
  super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
  super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl =
       (tuple<wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:97:10)>
       ::_M_manager;
  psVar8 = (string *)
           wasm::Options::add(psVar8,(string *)local_508,(string *)local_4e8,(string *)local_4c8,
                              (Arguments)&local_60,(function *)0x0,SUB81(&local_9d8,0));
  local_4a8[0] = local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"--input-source-map","");
  local_488[0] = local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"-ism","");
  local_468[0] = local_458;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_468,"Consume source map from the specified file","");
  local_9b0 = (pointer)0x0;
  local_9b8 = (pointer)((long)&outfile.field_2 + 8);
  local_9a0 = (pointer)std::
                       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:105:10)>
                       ::_M_invoke;
  local_9a8 = (pointer)std::
                       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:105:10)>
                       ::_M_manager;
  psVar8 = (string *)
           wasm::Options::add(psVar8,(string *)local_4a8,(string *)local_488,(string *)local_468,
                              (Arguments)&local_60,(function *)0x1,SUB81(&local_9b8,0));
  local_448[0] = local_438;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_448,"--no-legalize-javascript-ffi","");
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"-nj","");
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_408,
             "Do not fully legalize (i64->i32, f32->f64) the imports and exports for interfacing with JS"
             ,"");
  local_990._M_p = (pointer)0x0;
  local_998 = (pointer)((long)&WasmEmscriptenFinalizeOption.field_2 + 0xf);
  local_980 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:114:10)>
              ::_M_invoke;
  local_988 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:114:10)>
              ::_M_manager;
  psVar8 = (string *)
           wasm::Options::add(psVar8,(string *)local_448,(string *)local_428,(string *)local_408,
                              (Arguments)&local_60,(function *)0x0,SUB81(&local_998,0));
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"--bigint","");
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"-bi","");
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3a8,
             "Assume JS will use wasm/JS BigInt integration, so wasm i64s will turn into JS BigInts, and there is no need for any legalization at all (not even minimal legalization of dynCalls)"
             ,"");
  local_970._M_p = (pointer)0x0;
  local_978 = &local_38;
  local_960 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:124:10)>
              ::_M_invoke;
  local_968 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:124:10)>
              ::_M_manager;
  psVar8 = (string *)
           wasm::Options::add(psVar8,(string *)local_3e8,(string *)local_3c8,(string *)local_3a8,
                              (Arguments)&local_60,(function *)0x0,SUB81(&local_978,0));
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"--output-source-map","");
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"-osm","");
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,"Emit source map to the specified file","");
  local_950 = (pointer)0x0;
  local_958 = (long)&inputSourceMapFilename.field_2 + 8;
  local_940 = (pointer)std::
                       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:130:10)>
                       ::_M_invoke;
  local_948 = (pointer)std::
                       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:130:10)>
                       ::_M_manager;
  psVar8 = (string *)
           wasm::Options::add(psVar8,(string *)local_388,(string *)local_368,(string *)local_348,
                              (Arguments)&local_60,(function *)0x1,SUB81(&local_958,0));
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"--output-source-map-url","");
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"-osu","");
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e8,"Emit specified string as source map URL","");
  local_930 = 0;
  local_938 = (undefined1 *)((long)&outputSourceMapFilename.field_2 + 8);
  local_920 = (__buckets_ptr)
              std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:138:10)>
              ::_M_invoke;
  local_928 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:138:10)>
              ::_M_manager;
  psVar8 = (string *)
           wasm::Options::add(psVar8,(string *)local_328,(string *)local_308,(string *)local_2e8,
                              (Arguments)&local_60,(function *)0x1,SUB81(&local_938,0));
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"--check-stack-overflow","");
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"");
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,"Check for stack overflows every time the stack is extended","");
  local_910._M_nxt = (_Hash_node_base *)0x0;
  local_918 = &local_37;
  local_900 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:146:10)>
              ::_M_invoke;
  local_908 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:146:10)>
              ::_M_manager;
  psVar8 = (string *)
           wasm::Options::add(psVar8,(string *)local_2c8,(string *)local_2a8,(string *)local_288,
                              (Arguments)&local_60,(function *)0x0,SUB81(&local_918,0));
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"--standalone-wasm","");
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"");
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_228,
             "Emit a wasm file that does not depend on JS, as much as possible, using wasi and other standard conventions etc. where possible"
             ,"");
  local_8f0 = (__node_base_ptr)0x0;
  local_8f8 = &minimizeWasmChanges;
  local_8e0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:155:10)>
              ::_M_invoke;
  local_8e8 = (__buckets_ptr)
              std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:155:10)>
              ::_M_manager;
  psVar8 = (string *)
           wasm::Options::add(psVar8,(string *)local_268,(string *)local_248,(string *)local_228,
                              (Arguments)&local_60,(function *)0x0,SUB81(&local_8f8,0));
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"--minimize-wasm-changes","");
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,
             "Modify the wasm as little as possible. This is useful during development as we reduce the number of changes to the wasm, as it lets emscripten control how much modifications to do."
             ,"");
  local_8d0 = 0;
  local_8d8._M_nxt = (_Hash_node_base *)((long)&WasmEmscriptenFinalizeOption.field_2 + 0xe);
  local_8c0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:165:10)>
              ::_M_invoke;
  local_8c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:165:10)>
              ::_M_manager;
  psVar8 = (string *)
           wasm::Options::add(psVar8,(string *)local_208,(string *)local_1e8,(string *)local_1c8,
                              (Arguments)&local_60,(function *)0x0,SUB81(&local_8d8,0));
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"--no-dyncalls","");
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"");
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"");
  local_8b0 = (pointer)0x0;
  local_8b8 = (__node_base_ptr)local_36;
  local_8a0 = (pointer)std::
                       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:173:10)>
                       ::_M_invoke;
  local_8a8 = (pointer)std::
                       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:173:10)>
                       ::_M_manager;
  psVar8 = (string *)
           wasm::Options::add(psVar8,(string *)local_1a8,(string *)local_188,(string *)local_168,
                              (Arguments)&local_60,(function *)0x0,SUB81(&local_8b8,0));
  local_750[0] = local_740;
  local_610 = argv;
  local_64 = argc;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"--dyncalls-i64","");
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"");
  local_730[0] = local_720;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"");
  local_890._M_thread = 0;
  local_898 = local_36 + 1;
  local_880 = (__buckets_ptr)
              std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:179:10)>
              ::_M_invoke;
  local_888._M_b._M_p =
       (__base_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:179:10)>
       ::_M_manager;
  psVar8 = (string *)
           wasm::Options::add(psVar8,(string *)local_750,(string *)local_148,(string *)local_730,
                              (Arguments)&local_60,(function *)0x0,SUB81(&local_898,0));
  local_710[0] = local_700;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"INFILE","");
  local_870._M_nxt = (_Hash_node_base *)0x0;
  local_878 = (undefined1 *)((long)&outputSourceMapUrl.field_2 + 8);
  local_860 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:184:21)>
              ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:184:21)>
              ::_M_manager;
  wasm::Options::add_positional(psVar8,(Arguments)local_710,(function *)0x1);
  if (local_868 != (code *)0x0) {
    (*local_868)(&local_878,&local_878,3);
  }
  if (local_710[0] != local_700) {
    operator_delete(local_710[0],(ulong)((long)&local_700[0]->_M_nxt + 1));
  }
  if (local_888._M_b._M_p != (__pointer_type)0x0) {
    (*(code *)local_888._M_b._M_p)(&local_898,&local_898,3);
  }
  if (local_730[0] != local_720) {
    operator_delete(local_730[0],(ulong)((long)&(local_720[0]._M_nxt)->_M_nxt + 1));
  }
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  if (local_750[0] != local_740) {
    operator_delete(local_750[0],local_740[0] + 1);
  }
  if (local_8a8 != (pointer)0x0) {
    (*(code *)local_8a8)(&local_8b8,&local_8b8,3);
  }
  if (local_168[0] != local_158) {
    operator_delete(local_168[0],local_158[0] + 1);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0],local_178[0] + 1);
  }
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0],local_198[0] + 1);
  }
  if (local_8c8 != (code *)0x0) {
    (*local_8c8)(&local_8d8,&local_8d8,3);
  }
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  if (local_8e8 != (__buckets_ptr)0x0) {
    (*(code *)local_8e8)(&local_8f8,&local_8f8,3);
  }
  if (local_228[0] != local_218) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  if (local_268[0] != local_258) {
    operator_delete(local_268[0],local_258[0] + 1);
  }
  if (local_908 != (code *)0x0) {
    (*local_908)(&local_918,&local_918,3);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  if (local_2c8[0] != local_2b8) {
    operator_delete(local_2c8[0],local_2b8[0] + 1);
  }
  if (local_928 != (code *)0x0) {
    (*local_928)(&local_938,&local_938,3);
  }
  if (local_2e8[0] != local_2d8) {
    operator_delete(local_2e8[0],local_2d8[0] + 1);
  }
  if (local_308[0] != local_2f8) {
    operator_delete(local_308[0],local_2f8[0] + 1);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],local_318[0] + 1);
  }
  if (local_948 != (pointer)0x0) {
    (*(code *)local_948)(&local_958,&local_958,3);
  }
  if (local_348[0] != local_338) {
    operator_delete(local_348[0],local_338[0] + 1);
  }
  if (local_368[0] != local_358) {
    operator_delete(local_368[0],local_358[0] + 1);
  }
  if (local_388[0] != local_378) {
    operator_delete(local_388[0],local_378[0] + 1);
  }
  if (local_968 != (code *)0x0) {
    (*local_968)(&local_978,&local_978,3);
  }
  if (local_3a8[0] != local_398) {
    operator_delete(local_3a8[0],local_398[0] + 1);
  }
  if (local_3c8[0] != local_3b8) {
    operator_delete(local_3c8[0],local_3b8[0] + 1);
  }
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  if (local_988 != (code *)0x0) {
    (*local_988)(&local_998,&local_998,3);
  }
  if (local_408[0] != local_3f8) {
    operator_delete(local_408[0],local_3f8[0] + 1);
  }
  if (local_428[0] != local_418) {
    operator_delete(local_428[0],local_418[0] + 1);
  }
  if (local_448[0] != local_438) {
    operator_delete(local_448[0],local_438[0] + 1);
  }
  if (local_9a8 != (pointer)0x0) {
    (*(code *)local_9a8)(&local_9b8,&local_9b8,3);
  }
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  if (local_488[0] != local_478) {
    operator_delete(local_488[0],local_478[0] + 1);
  }
  if (local_4a8[0] != local_498) {
    operator_delete(local_4a8[0],local_498[0] + 1);
  }
  if ((_Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>)
      local_9c8._M_t.
      super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
      super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl != (DylinkSection *)0x0) {
    (*(code *)local_9c8._M_t.
              super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
              .super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl)
              (&local_9d8,&local_9d8,3);
  }
  if (local_4c8[0] != local_4b8) {
    operator_delete(local_4c8[0],local_4b8[0] + 1);
  }
  if (local_4e8[0] != local_4d8) {
    operator_delete(local_4e8[0],local_4d8[0] + 1);
  }
  if (local_508[0] != local_4f8) {
    operator_delete(local_508[0],local_4f8[0] + 1);
  }
  if (local_9e8 != (code *)0x0) {
    (*local_9e8)(&local_9f8,&local_9f8,3);
  }
  if (local_528[0] != local_518) {
    operator_delete(local_528[0],local_518[0] + 1);
  }
  if (local_548[0] != local_538) {
    operator_delete(local_548[0],local_538[0] + 1);
  }
  if (local_568[0] != local_558) {
    operator_delete(local_568[0],local_558[0] + 1);
  }
  if (local_a08 != (pointer)0x0) {
    (*(code *)local_a08)(&local_a18,&local_a18,3);
  }
  if (local_588[0] != local_578) {
    operator_delete(local_588[0],local_578[0] + 1);
  }
  if (local_5a8[0] != local_598) {
    operator_delete(local_5a8[0],local_598[0] + 1);
  }
  if (local_5c8[0] != local_5b8) {
    operator_delete(local_5c8[0],local_5b8[0] + 1);
  }
  if (local_a28 != (pointer)0x0) {
    (*(code *)local_a28)(&local_a38,&local_a38,3);
  }
  if (local_5e8[0] != local_5d8) {
    operator_delete(local_5e8[0],local_5d8[0] + 1);
  }
  if (local_608[0] != local_5f8) {
    operator_delete(local_608[0],local_5f8[0] + 1);
  }
  if ((long *)infile.field_2._8_8_ != local_78) {
    operator_delete((void *)infile.field_2._8_8_,local_78[0] + 1);
  }
  if ((pointer)local_ab0._16_8_ != (pointer)0x0) {
    (*(code *)local_ab0._16_8_)(local_ab0,local_ab0,3);
  }
  if (local_ba0 != local_b90) {
    operator_delete(local_ba0,local_b90[0] + 1);
  }
  if (local_eb0 != (undefined1  [8])local_ea0) {
    operator_delete((void *)local_eb0,local_ea0[0]._M_allocated_capacity + 1);
  }
  if ((long *)options._376_8_ != local_1290) {
    operator_delete((void *)options._376_8_,local_1290[0] + 1);
  }
  wasm::Options::parse((int)&options,(char **)(ulong)local_64);
  iVar7 = std::__cxx11::string::compare(outputSourceMapUrl.field_2._M_local_buf + 8);
  bVar5 = legalizeJavaScriptFFI;
  if (iVar7 == 0) {
    wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
    wasm::Fatal::operator<<
              ((Fatal *)&options.enabledFeatures,(char (*) [27])"Need to specify an infile\n");
    wasm::Fatal::~Fatal((Fatal *)&options.enabledFeatures);
  }
  bVar17 = outfile._M_dataplus._M_p != (pointer)0x0;
  wasm::Module::Module((Module *)&options.enabledFeatures);
  bVar12 = bVar5 ^ 1;
  local_1128 = ~options.profile & (local_1128 | options._368_4_);
  uVar4 = (ulong)infile.field_2._8_8_ >> 0x10;
  infile.field_2._8_2_ = CONCAT11(sideModule & (bVar17 | bVar12),bVar17 | bVar12 & 1);
  infile.field_2._8_8_ = CONCAT62((int6)uVar4,infile.field_2._8_2_) & 0xffffffff;
  local_6f0[0] = local_6e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_6f0,outputSourceMapUrl.field_2._8_8_,
             infile._M_dataplus._M_p + outputSourceMapUrl.field_2._8_8_);
  local_6d0[0] = local_6c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_6d0,outfile.field_2._8_8_,
             inputSourceMapFilename._M_dataplus._M_p + outfile.field_2._8_8_);
  wasm::ModuleReader::read
            ((undefined1 *)((long)&infile.field_2 + 8),local_6f0,&options.enabledFeatures,local_6d0)
  ;
  if (local_6d0[0] != local_6c0) {
    operator_delete(local_6d0[0],local_6c0[0] + 1);
  }
  if (local_6f0[0] != local_6e0) {
    operator_delete(local_6f0[0],local_6e0[0] + 1);
  }
  if (options.passOptions.passesToSkip._M_h._M_single_bucket._1_1_ == '\0') {
    while (local_10c8 != (undefined8 *)0x0) {
      puVar13 = (undefined8 *)*local_10c8;
      operator_delete(local_10c8,0x20);
      local_10c8 = puVar13;
    }
    memset(local_10d8,0,local_10d0 << 3);
    local_10c8 = (undefined8 *)0x0;
    uStack_10c0 = 0;
  }
  cVar6 = wasm::isDebugEnabled("emscripten-dump");
  if (cVar6 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Module before:\n",0xf)
    ;
  }
  cVar6 = wasm::isDebugEnabled("emscripten-dump");
  if (cVar6 != '\0') {
    std::ostream::_M_insert<void_const*>(&std::cerr);
  }
  puVar1 = &options.field_0xb0;
  puVar13 = (undefined8 *)puVar1;
  pPVar14 = &local_14d8;
  for (lVar11 = 8; lVar11 != 0; lVar11 = lVar11 + -1) {
    uVar3 = *puVar13;
    pPVar14->debug = (bool)(char)uVar3;
    pPVar14->validate = (bool)(char)((ulong)uVar3 >> 8);
    pPVar14->validateGlobally = (bool)(char)((ulong)uVar3 >> 0x10);
    pPVar14->field_0x3 = (char)((ulong)uVar3 >> 0x18);
    pPVar14->optimizeLevel = (int)((ulong)uVar3 >> 0x20);
    puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
    pPVar14 = (PassOptions *)((long)pPVar14 + ((ulong)bVar18 * -2 + 1) * 8);
  }
  local_14d8.targetJS =
       options.passOptions.printStackIR.
       super__Optional_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_true,_true>.
       _M_payload.super__Optional_payload_base<std::basic_ostream<char,_std::char_traits<char>_>_*>.
       _M_engaged;
  this = &local_14d8.arguments;
  local_14d8.arguments._M_h._M_buckets = (__buckets_ptr)0x0;
  local_14d8.arguments._M_h._M_bucket_count =
       (size_type)options.passOptions.arguments._M_h._M_buckets;
  local_14d8.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_14d8.arguments._M_h._M_element_count =
       (size_type)options.passOptions.arguments._M_h._M_before_begin._M_nxt;
  local_14d8.arguments._M_h._M_rehash_policy._0_8_ =
       options.passOptions.arguments._M_h._M_element_count;
  local_14d8.arguments._M_h._M_rehash_policy._M_next_resize =
       options.passOptions.arguments._M_h._M_rehash_policy._0_8_;
  local_14d8.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_eb0 = (undefined1  [8])this;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this,(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&options.passOptions.targetJS,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
              *)local_eb0);
  this_00 = &local_14d8.passesToSkip;
  local_14d8.passesToSkip._M_h._M_buckets = (__buckets_ptr)0x0;
  local_14d8.passesToSkip._M_h._M_bucket_count =
       (size_type)options.passOptions.passesToSkip._M_h._M_buckets;
  local_14d8.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_14d8.passesToSkip._M_h._M_element_count =
       (size_type)options.passOptions.passesToSkip._M_h._M_before_begin._M_nxt;
  local_14d8.passesToSkip._M_h._M_rehash_policy._0_8_ =
       options.passOptions.passesToSkip._M_h._M_element_count;
  local_14d8.passesToSkip._M_h._M_rehash_policy._M_next_resize =
       options.passOptions.passesToSkip._M_h._M_rehash_policy._0_8_;
  local_14d8.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_eb0 = (undefined1  [8])this_00;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)this_00,
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&options.passOptions.arguments._M_h._M_single_bucket,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              *)local_eb0);
  wasm::PassRunner::PassRunner
            ((PassRunner *)&local_ba0,(Module *)&options.enabledFeatures,&local_14d8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&this->_M_h);
  local_b70 = options._vptr_ToolOptions._0_1_;
  local_b6e = options._vptr_ToolOptions._0_1_;
  local_b4a = local_36[2];
  if (local_37 == '\x01') {
    if (minimizeWasmChanges == false) {
      local_eb0 = (undefined1  [8])local_ea0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_eb0,"stack-check-handler","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[](local_b28,(key_type *)local_eb0);
      std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x111634);
      if (local_eb0 != (undefined1  [8])local_ea0) {
        operator_delete((void *)local_eb0,local_ea0[0]._M_allocated_capacity + 1);
      }
    }
    local_6b0[0] = local_6a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6b0,"stack-check","");
    local_838 = '\0';
    wasm::PassRunner::add(&local_ba0,local_6b0,local_858);
    if ((local_838 == '\x01') && (local_838 = '\0', local_858[0] != local_848)) {
      operator_delete(local_858[0],(long)local_848[0] + 1);
    }
    if (local_6b0[0] != local_6a0) {
      operator_delete(local_6b0[0],local_6a0[0] + 1);
    }
  }
  if ((local_36[0] == '\0') && (minimizeWasmChanges == false)) {
    if (local_36[1] == '\x01') {
      p_Var16 = local_780;
      local_790[0]._M_nxt = p_Var16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_790,"generate-i64-dyncalls","");
      local_810 = '\0';
      wasm::PassRunner::add(&local_ba0,local_790,local_830);
      _Var15._M_nxt = local_790[0]._M_nxt;
      if ((local_810 == '\x01') && (local_810 = '\0', local_830[0] != local_820)) {
        operator_delete(local_830[0],local_820[0] + 1);
        _Var15._M_nxt = local_790[0]._M_nxt;
      }
    }
    else {
      p_Var16 = local_760;
      local_770[0] = p_Var16;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_770,"generate-dyncalls","");
      local_7e8 = '\0';
      wasm::PassRunner::add(&local_ba0,local_770,local_808);
      _Var15._M_nxt = local_770[0];
      if ((local_7e8 == '\x01') && (local_7e8 = '\0', local_808[0] != local_7f8)) {
        operator_delete(local_808[0],local_7f8[0] + 1);
        _Var15._M_nxt = local_770[0];
      }
    }
    if (_Var15._M_nxt != p_Var16) {
      operator_delete(_Var15._M_nxt,(ulong)((long)&p_Var16->_M_nxt->_M_nxt + 1));
    }
  }
  if ((local_38 == '\0') && (WasmEmscriptenFinalizeOption.field_2._M_local_buf[0xf] == '\x01')) {
    local_690[0] = local_680;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_690,"legalize-js-interface","");
    local_7c0 = '\0';
    wasm::PassRunner::add(&local_ba0,local_690,local_7e0);
    if ((local_7c0 == '\x01') && (local_7c0 = '\0', local_7e0[0] != local_7d0)) {
      operator_delete(local_7e0[0],(ulong)((long)&(local_7d0[0]._M_nxt)->_M_nxt + 1));
    }
    if (local_690[0] != local_680) {
      operator_delete(local_690[0],local_680[0] + 1);
    }
  }
  if (sideModule == false) {
    local_670[0] = local_660;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"strip-dwarf","");
    local_798 = '\0';
    wasm::PassRunner::add(&local_ba0,local_670,local_7b8);
    if ((local_798 == '\x01') && (local_798 = '\0', local_7b8[0] != local_7a8)) {
      operator_delete(local_7b8[0],(ulong)((long)&local_7a8[0]->_M_nxt + 1));
    }
    if (local_670[0] != local_660) {
      operator_delete(local_670[0],local_660[0] + 1);
    }
  }
  wasm::PassRunner::run();
  cVar6 = wasm::isDebugEnabled("emscripten-dump");
  if (cVar6 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Module after:\n",0xe);
  }
  cVar6 = wasm::isDebugEnabled("emscripten-dump");
  if (cVar6 != '\0') {
    poVar10 = (ostream *)std::operator<<((ostream *)&std::cerr,(Module *)&options.enabledFeatures);
    local_eb0[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_eb0,1);
  }
  if (bVar17 || (bVar12 & 1) != 0) {
    wasm::Output::Output((Output *)local_eb0,(string *)&local_128,legalizeJavaScriptFFI ^ Text);
    puVar2 = (pointer)(local_ab0 + 0x28);
    local_ab0._32_8_ = (pointer)0x0;
    local_ab0[0x28] = 0;
    local_a70 = (pointer)0x0;
    local_a68[0]._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl._0_1_ = 0;
    local_a50 = (pointer)0x0;
    local_a48[0]._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
    super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl._0_1_ = 0;
    local_ab0[0] = local_36[2];
    local_ab0._16_8_ =
         CONCAT71(SUB87(local_ab0._16_8_,1),legalizeJavaScriptFFI) & 0xffffffffffff00ff;
    local_ab0._8_8_ = puVar1;
    local_ab0._24_8_ = puVar2;
    local_a78 = local_a68;
    local_a58 = local_a48;
    if (outputSourceMapFilename._M_dataplus._M_p != (pointer)0x0) {
      local_650[0] = local_640;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_650,inputSourceMapFilename.field_2._8_8_,
                 outputSourceMapFilename._M_dataplus._M_p + inputSourceMapFilename.field_2._8_8_);
      std::__cxx11::string::_M_assign((string *)&local_a78);
      if (local_650[0] != local_640) {
        operator_delete(local_650[0],local_640[0] + 1);
      }
      local_630[0] = local_620;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_630,outputSourceMapFilename.field_2._8_8_,
                 outputSourceMapUrl._M_dataplus._M_p + outputSourceMapFilename.field_2._8_8_);
      std::__cxx11::string::_M_assign((string *)&local_a58);
      if (local_630[0] != local_620) {
        operator_delete(local_630[0],local_620[0] + 1);
      }
    }
    wasm::ModuleWriter::write((Module *)local_ab0,(Output *)&options.enabledFeatures);
    if (local_a58 != local_a48) {
      operator_delete(local_a58,
                      CONCAT71(local_a48[0]._M_t.
                               super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                               super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl._1_7_,
                               local_a48[0]._M_t.
                               super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                               super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl._0_1_) + 1);
    }
    if (local_a78 != local_a68) {
      operator_delete(local_a78,
                      CONCAT71(local_a68[0]._M_t.
                               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                               .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl._1_7_,
                               local_a68[0]._M_t.
                               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                               .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl._0_1_) + 1
                     );
    }
    if ((pointer)local_ab0._24_8_ != puVar2) {
      operator_delete((void *)local_ab0._24_8_,CONCAT71(local_ab0._41_7_,local_ab0[0x28]) + 1);
    }
    wasm::Output::~Output((Output *)local_eb0);
  }
  wasm::PassRunner::~PassRunner((PassRunner *)&local_ba0);
  wasm::Module::~Module((Module *)&options.enabledFeatures);
  wasm::ToolOptions::~ToolOptions((ToolOptions *)local_1420);
  if (local_60 != &WasmEmscriptenFinalizeOption._M_string_length) {
    operator_delete(local_60,WasmEmscriptenFinalizeOption._M_string_length + 1);
  }
  if ((size_type *)outputSourceMapFilename.field_2._8_8_ != &outputSourceMapUrl._M_string_length) {
    operator_delete((void *)outputSourceMapFilename.field_2._8_8_,
                    CONCAT71(outputSourceMapUrl._M_string_length._1_7_,
                             (undefined1)outputSourceMapUrl._M_string_length) + 1);
  }
  if ((size_type *)inputSourceMapFilename.field_2._8_8_ != &outputSourceMapFilename._M_string_length
     ) {
    operator_delete((void *)inputSourceMapFilename.field_2._8_8_,
                    CONCAT71(outputSourceMapFilename._M_string_length._1_7_,
                             (undefined1)outputSourceMapFilename._M_string_length) + 1);
  }
  if ((size_type *)outfile.field_2._8_8_ != &inputSourceMapFilename._M_string_length) {
    operator_delete((void *)outfile.field_2._8_8_,
                    CONCAT71(inputSourceMapFilename._M_string_length._1_7_,
                             (undefined1)inputSourceMapFilename._M_string_length) + 1);
  }
  if (local_128._M_head_impl != (Export *)&outfile._M_string_length) {
    operator_delete(local_128._M_head_impl,
                    CONCAT71(outfile._M_string_length._1_7_,(undefined1)outfile._M_string_length) +
                    1);
  }
  if ((size_type *)outputSourceMapUrl.field_2._8_8_ != &infile._M_string_length) {
    operator_delete((void *)outputSourceMapUrl.field_2._8_8_,
                    CONCAT71(infile._M_string_length._1_7_,(undefined1)infile._M_string_length) + 1)
    ;
  }
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  std::string infile;
  std::string outfile;
  std::string inputSourceMapFilename;
  std::string outputSourceMapFilename;
  std::string outputSourceMapUrl;
  bool emitBinary = true;
  bool debugInfo = false;
  bool DWARF = false;
  bool sideModule = false;
  bool legalizeJavaScriptFFI = true;
  bool bigInt = false;
  bool checkStackOverflow = false;
  bool standaloneWasm = false;
  // TODO: remove after https://github.com/WebAssembly/binaryen/issues/3043
  bool minimizeWasmChanges = false;
  bool noDynCalls = false;
  bool onlyI64DynCalls = false;

  const std::string WasmEmscriptenFinalizeOption =
    "wasm-emscripten-finalize options";

  ToolOptions options("wasm-emscripten-finalize",
                      "Performs Emscripten-specific transforms on .wasm files");
  options
    .add("--output",
         "-o",
         "Output file",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::One,
         [&outfile](Options*, const std::string& argument) {
           outfile = argument;
           Colors::setEnabled(false);
         })
    .add("--debuginfo",
         "-g",
         "Emit names section in wasm binary (or full debuginfo in wast)",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&debugInfo](Options*, const std::string&) { debugInfo = true; })
    .add("--dwarf",
         "",
         "Update DWARF debug info",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&DWARF](Options*, const std::string&) { DWARF = true; })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file. "
         "In this mode if no output file is specified, we write to stdout.",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&emitBinary](Options*, const std::string&) { emitBinary = false; })
    .add("--side-module",
         "",
         "Input is an emscripten side module",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&sideModule](Options* o, const std::string& argument) {
           sideModule = true;
         })
    .add("--input-source-map",
         "-ism",
         "Consume source map from the specified file",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::One,
         [&inputSourceMapFilename](Options* o, const std::string& argument) {
           inputSourceMapFilename = argument;
         })
    .add("--no-legalize-javascript-ffi",
         "-nj",
         "Do not fully legalize (i64->i32, "
         "f32->f64) the imports and exports for interfacing with JS",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&legalizeJavaScriptFFI](Options* o, const std::string&) {
           legalizeJavaScriptFFI = false;
         })
    .add("--bigint",
         "-bi",
         "Assume JS will use wasm/JS BigInt integration, so wasm i64s will "
         "turn into JS BigInts, and there is no need for any legalization at "
         "all (not even minimal legalization of dynCalls)",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&bigInt](Options* o, const std::string&) { bigInt = true; })
    .add("--output-source-map",
         "-osm",
         "Emit source map to the specified file",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::One,
         [&outputSourceMapFilename](Options* o, const std::string& argument) {
           outputSourceMapFilename = argument;
         })
    .add("--output-source-map-url",
         "-osu",
         "Emit specified string as source map URL",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::One,
         [&outputSourceMapUrl](Options* o, const std::string& argument) {
           outputSourceMapUrl = argument;
         })
    .add("--check-stack-overflow",
         "",
         "Check for stack overflows every time the stack is extended",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&checkStackOverflow](Options* o, const std::string&) {
           checkStackOverflow = true;
         })
    .add("--standalone-wasm",
         "",
         "Emit a wasm file that does not depend on JS, as much as possible,"
         " using wasi and other standard conventions etc. where possible",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&standaloneWasm](Options* o, const std::string&) {
           standaloneWasm = true;
         })
    .add("--minimize-wasm-changes",
         "",
         "Modify the wasm as little as possible. This is useful during "
         "development as we reduce the number of changes to the wasm, as it "
         "lets emscripten control how much modifications to do.",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&minimizeWasmChanges](Options* o, const std::string&) {
           minimizeWasmChanges = true;
         })
    .add("--no-dyncalls",
         "",
         "",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&noDynCalls](Options* o, const std::string&) { noDynCalls = true; })
    .add("--dyncalls-i64",
         "",
         "",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&onlyI64DynCalls](Options* o, const std::string&) {
           onlyI64DynCalls = true;
         })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [&infile](Options* o, const std::string& argument) {
                      infile = argument;
                    });
  options.parse(argc, argv);

  if (infile == "") {
    Fatal() << "Need to specify an infile\n";
  }

  // We will write the modified wasm if the user asked us to, either by
  // specifying an output file or requesting text output (which goes to stdout
  // by default).
  auto writeOutput = outfile.size() > 0 || !emitBinary;

  Module wasm;
  options.applyOptionsBeforeParse(wasm);
  ModuleReader reader;
  // If we are not writing output then we definitely don't need to read debug
  // info. However, if we emit output then definitely load the names section so
  // that we roundtrip names properly.
  reader.setDebugInfo(writeOutput);
  reader.setDWARF(DWARF && writeOutput);
  if (!writeOutput) {
    // If we are not writing the output then all we are doing is simple parsing
    // of metadata from global parts of the wasm such as imports and exports. In
    // that case, it is unnecessary to parse function contents which are the
    // great bulk of the work, and we can skip all that.
    // Note that the one case we do need function bodies for, pthreads + EM_ASM
    // parsing, requires special handling. The start function has code that we
    // parse in order to find the EM_ASMs, and for that reason the binary reader
    // will still parse the start function even in this mode.
    reader.setSkipFunctionBodies(true);
  }
  try {
    reader.read(infile, wasm, inputSourceMapFilename);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    std::cerr << '\n';
    Fatal() << "error in parsing input";
  } catch (MapParseException& p) {
    p.dump(std::cerr);
    std::cerr << '\n';
    Fatal() << "error in parsing wasm source map";
  }

  options.applyOptionsAfterParse(wasm);

  BYN_TRACE_WITH_TYPE("emscripten-dump", "Module before:\n");
  BYN_DEBUG_WITH_TYPE("emscripten-dump", std::cerr << &wasm);

  EmscriptenGlueGenerator generator(wasm);
  generator.standalone = standaloneWasm;
  generator.sideModule = sideModule;
  generator.minimizeWasmChanges = minimizeWasmChanges;
  generator.onlyI64DynCalls = onlyI64DynCalls;
  generator.noDynCalls = noDynCalls;

  PassRunner passRunner(&wasm, options.passOptions);
  passRunner.setDebug(options.debug);
  passRunner.setDebugInfo(debugInfo);

  if (checkStackOverflow) {
    if (!standaloneWasm) {
      // In standalone mode we don't set a handler at all.. which means
      // just trap on overflow.
      passRunner.options.arguments["stack-check-handler"] =
        "__handle_stack_overflow";
    }
    passRunner.add("stack-check");
  }

  if (!noDynCalls && !standaloneWasm) {
    // If not standalone wasm then JS is relevant and we need dynCalls.
    if (onlyI64DynCalls) {
      passRunner.add("generate-i64-dyncalls");
    } else {
      passRunner.add("generate-dyncalls");
    }
  }

  // Legalize the wasm, if BigInts don't make that moot.
  if (!bigInt && legalizeJavaScriptFFI) {
    passRunner.add("legalize-js-interface");
  }

  // If DWARF is unused, strip it out. This avoids us keeping it alive
  // until wasm-opt strips it later.
  if (!DWARF) {
    passRunner.add("strip-dwarf");
  }

  passRunner.run();

  BYN_TRACE_WITH_TYPE("emscripten-dump", "Module after:\n");
  BYN_DEBUG_WITH_TYPE("emscripten-dump", std::cerr << wasm << '\n');

  if (writeOutput) {
    Output output(outfile, emitBinary ? Flags::Binary : Flags::Text);
    ModuleWriter writer(options.passOptions);
    writer.setDebugInfo(debugInfo);
    // writer.setSymbolMap(symbolMap);
    writer.setBinary(emitBinary);
    if (outputSourceMapFilename.size()) {
      writer.setSourceMapFilename(outputSourceMapFilename);
      writer.setSourceMapUrl(outputSourceMapUrl);
    }
    writer.write(wasm, output);
  }
  return 0;
}